

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr
GetFunctionNameInScope
          (ExpressionContext *ctx,ScopeData *scope,TypeBase *parentType,InplaceStr str,
          bool isOperator,bool isAccessor)

{
  NamespaceData *pNVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 extraout_var_00;
  char *pcVar6;
  ScopeData *pSVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  ScopeData *curr;
  InplaceStr IVar14;
  
  pcVar12 = str.end;
  pcVar6 = str.begin;
  if (parentType == (TypeBase *)0x0) {
    if (isOperator) goto LAB_00231200;
    if (isAccessor) {
      __assert_fail("!isAccessor",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x256,
                    "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                   );
    }
    uVar8 = (long)pcVar12 - (long)pcVar6;
    bVar2 = false;
    if (scope == (ScopeData *)0x0) {
      iVar3 = (int)uVar8;
    }
    else {
      uVar10 = uVar8 & 0xffffffff;
      pSVar7 = scope;
      do {
        if ((pSVar7->type == SCOPE_TEMPORARY) ||
           ((pSVar7->ownerFunction != (FunctionData *)0x0 && (!bVar2)))) goto LAB_00231200;
        if ((pSVar7->ownerType != (TypeBase *)0x0) && (!bVar2)) {
          __assert_fail("foundNamespace",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                        ,0x267,
                        "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                       );
        }
        pNVar1 = pSVar7->ownerNamespace;
        if (pNVar1 != (NamespaceData *)0x0) {
          uVar10 = (ulong)((int)uVar10 +
                           (*(int *)&(pNVar1->name).name.end - *(int *)&(pNVar1->name).name.begin) +
                          1);
          bVar2 = true;
        }
        iVar3 = (int)uVar10;
        pSVar7 = pSVar7->scope;
      } while (pSVar7 != (ScopeData *)0x0);
    }
    if (!bVar2) goto LAB_00231200;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(iVar3 + 1));
    pcVar12 = (char *)CONCAT44(extraout_var_00,iVar4);
    pcVar12[(ulong)(iVar3 + 1) - 1] = '\0';
    pcVar13 = pcVar12 + ((ulong)(iVar3 + 1) - 1) + -(uVar8 & 0xffffffff);
    memcpy(pcVar13,pcVar6,uVar8 & 0xffffffff);
    for (; scope != (ScopeData *)0x0; scope = scope->scope) {
      pNVar1 = scope->ownerNamespace;
      if (pNVar1 != (NamespaceData *)0x0) {
        pcVar6 = (pNVar1->name).name.begin;
        iVar3 = *(int *)&(pNVar1->name).name.end;
        pcVar13[-1] = '.';
        uVar8 = (ulong)(uint)(iVar3 - (int)pcVar6);
        pcVar13 = pcVar13 + (-1 - uVar8);
        memcpy(pcVar13,pcVar6,uVar8);
      }
    }
    if (pcVar13 != pcVar12) {
      __assert_fail("pos == name",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x28f,
                    "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                   );
    }
    sVar5 = strlen(pcVar12);
    pcVar6 = pcVar12;
  }
  else {
    uVar11 = (int)str.end - (int)str.begin;
    uVar8 = (ulong)((*(int *)&(parentType->name).end - *(int *)&(parentType->name).begin) +
                    uVar11 + isAccessor + 3);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,uVar8);
    pcVar13 = (char *)CONCAT44(extraout_var,iVar3);
    pcVar12 = (parentType->name).begin;
    pcVar9 = "";
    if (isAccessor) {
      pcVar9 = "$";
    }
    NULLC::SafeSprintf(pcVar13,uVar8,"%.*s::%.*s%s",
                       (ulong)(uint)(*(int *)&(parentType->name).end - (int)pcVar12),pcVar12,
                       (ulong)uVar11,pcVar6,pcVar9);
    sVar5 = strlen(pcVar13);
    pcVar6 = pcVar13;
    if (sVar5 + 1 != uVar8) {
      __assert_fail("strlen(name) + 1 == nameLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x24f,
                    "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                   );
    }
  }
  pcVar12 = pcVar6 + sVar5;
LAB_00231200:
  IVar14.end = pcVar12;
  IVar14.begin = pcVar6;
  return IVar14;
}

Assistant:

InplaceStr GetFunctionNameInScope(ExpressionContext &ctx, ScopeData *scope, TypeBase *parentType, InplaceStr str, bool isOperator, bool isAccessor)
{
	if(parentType)
	{
		unsigned nameLength = parentType->name.length() + 2 + str.length() + (isAccessor ? 1 : 0) + 1;
		char *name = (char*)ctx.allocator->alloc(nameLength);

		NULLC::SafeSprintf(name, nameLength, "%.*s::%.*s%s", FMT_ISTR(parentType->name), FMT_ISTR(str), isAccessor ? "$" : "");

		assert(strlen(name) + 1 == nameLength);
		return InplaceStr(name);
	}

	if(isOperator)
		return str;

	assert(!isAccessor);

	bool foundNamespace = false;

	unsigned nameLength = str.length();

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		// Temporary scope is not evaluated
		if(curr->type == SCOPE_TEMPORARY)
			return str;

		// Function scope, just use the name
		if(curr->ownerFunction && !foundNamespace)
			return str;

		if(curr->ownerType)
			assert(foundNamespace);

		if(curr->ownerNamespace)
		{
			nameLength += curr->ownerNamespace->name.name.length() + 1;

			foundNamespace = true;
		}
	}

	nameLength += 1;

	if(!foundNamespace)
		return str;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	// Format a string back-to-front
	char *pos = name + nameLength;

	pos -= 1;
	*pos = 0;

	pos -= str.length();
	memcpy(pos, str.begin, str.length());

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if(curr->ownerNamespace)
		{
			InplaceStr nsName = curr->ownerNamespace->name.name;

			pos -= 1;
			*pos = '.';

			pos -= nsName.length();
			memcpy(pos, nsName.begin, nsName.length());
		}
	}

	assert(pos == name);

	return InplaceStr(name);
}